

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

void Abc_NtkCollectHie_rec(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  int iVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  int i;
  
  if (-1 < pNtk->iStep) {
    return;
  }
  p = Abc_NtkDfsBoxes(pNtk);
  iVar1 = p->nSize;
  for (i = 0; i < iVar1; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p,i);
    if (((*(uint *)((long)pvVar2 + 0x14) & 0xe) == 8 || (*(uint *)((long)pvVar2 + 0x14) & 0xf) == 10
        ) && (*(Abc_Ntk_t **)((long)pvVar2 + 0x38) != pNtk)) {
      Abc_NtkCollectHie_rec(*(Abc_Ntk_t **)((long)pvVar2 + 0x38),vModels);
    }
  }
  Vec_PtrFree(p);
  pNtk->iStep = vModels->nSize;
  Vec_PtrPush(vModels,pNtk);
  return;
}

Assistant:

void Abc_NtkCollectHie_rec( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk->iStep >= 0 )
        return;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Abc_NtkCollectHie_rec( (Abc_Ntk_t *)pObj->pData, vModels );
    Vec_PtrFree( vOrder );
    pNtk->iStep = Vec_PtrSize(vModels);
    Vec_PtrPush( vModels, pNtk );
}